

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initest.c
# Opt level: O2

void pacf_burg(double *vec,int N,double *par,int M)

{
  double *phi;
  ulong uVar1;
  ulong uVar2;
  double local_48;
  double var;
  double *local_38;
  
  var = (double)par;
  local_38 = vec;
  phi = (double *)malloc((long)M * 8);
  uVar2 = 0;
  uVar1 = (ulong)(uint)M;
  if (M < 1) {
    uVar1 = uVar2;
  }
  while (uVar1 != uVar2) {
    burgalg(local_38,N + -1,(int)(uVar2 + 1),phi,&local_48);
    *(double *)((long)var + uVar2 * 8) = phi[uVar2];
    uVar2 = uVar2 + 1;
  }
  free(phi);
  return;
}

Assistant:

void pacf_burg(double* vec, int N, double* par, int M) {
	int i;
	double *temp;
	double var;

	temp = (double*)malloc(sizeof(double)* M);
	for (i = 0; i < M; ++i) {
		burgalg(vec, N-1, i + 1, temp, &var);
		par[i] = temp[i];
	}
	free(temp);
}